

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O0

ssize_t __thiscall
crnlib::dynamic_stream::read(dynamic_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint uVar2;
  uchar *__src;
  undefined4 in_register_00000034;
  uint bytes_left;
  uint len_local;
  void *pBuf_local;
  dynamic_stream *this_local;
  
  if (((((this->super_data_stream).field_0x1a & 1) == 0) ||
      (bVar1 = data_stream::is_readable(&this->super_data_stream), !bVar1)) || ((uint)__buf == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    uVar2 = vector<unsigned_char>::size(&this->m_buf);
    this_local._4_4_ = math::minimum<unsigned_int>((uint)__buf,uVar2 - this->m_ofs);
    if (this_local._4_4_ != 0) {
      __src = vector<unsigned_char>::operator[](&this->m_buf,this->m_ofs);
      memcpy((void *)CONCAT44(in_register_00000034,__fd),__src,(ulong)this_local._4_4_);
    }
    this->m_ofs = this_local._4_4_ + this->m_ofs;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

virtual uint read(void* pBuf, uint len)
        {
            CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

            if ((!m_opened) || (!is_readable()) || (!len))
            {
                return 0;
            }

            CRNLIB_ASSERT(m_ofs <= m_buf.size());

            uint bytes_left = m_buf.size() - m_ofs;

            len = math::minimum<uint>(len, bytes_left);

            if (len)
            {
                memcpy(pBuf, &m_buf[m_ofs], len);
            }

            m_ofs += len;

            return len;
        }